

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Expressions.cpp
# Opt level: O0

void __thiscall CIdPtrExp::CIdPtrExp(CIdPtrExp *this,string *name,int *address)

{
  int *address_local;
  string *name_local;
  CIdPtrExp *this_local;
  
  IExpression::IExpression((IExpression *)this);
  (this->super_IExpression).super_PositionedNode.super_INode._vptr_INode =
       (_func_int **)&PTR_Accept_00236e20;
  std::__cxx11::string::string((string *)&this->name);
  std::__cxx11::string::operator=((string *)&this->name,(string *)name);
  this->address = address;
  return;
}

Assistant:

CIdPtrExp::CIdPtrExp( const std::string &name, int *address ) {
    this->name = name;
    this->address = address;
}